

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O0

int If_ManSatDeriveGiaFromBits
              (void *pGia,Ifn_Ntk_t *p,word *pConfigData,Vec_Int_t *vLeaves,Vec_Int_t *vCover)

{
  int iVar1;
  int iVar2;
  int c;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint nVars;
  int *pMap;
  undefined1 local_1078 [8];
  Vec_Int_t Leaves;
  word wStack_1060;
  int nMints;
  word uTruth;
  int pFaninLits [16];
  int *pFans;
  int nFans;
  int Type;
  int fCompl;
  int nPermBits;
  int nTtBits;
  int pVarMap [1000];
  int local_48;
  int nVarsNew;
  int iVar;
  int iLit;
  int k;
  int i;
  Gia_Man_t *pNew;
  Vec_Int_t *vCover_local;
  Vec_Int_t *vLeaves_local;
  word *pConfigData_local;
  Ifn_Ntk_t *p_local;
  void *pGia_local;
  
  local_48 = 0;
  iVar1 = p->nParsVIni - p->nObjs;
  iVar2 = Abc_Base2Log(p->nInps + 1);
  iVar2 = iVar2 + 1;
  c = Abc_TtGetBit(pConfigData,iVar1 + iVar2 * p->nInps);
  iVar3 = Vec_IntSize(vLeaves);
  if ((iVar3 <= p->nInps) && (p->nParsVIni < 1000)) {
    iLit = 0;
    while( true ) {
      if (p->nInps <= iLit) {
        iLit = p->nInps;
        while( true ) {
          if (p->nObjs <= iLit) {
            if (local_48 != iVar1) {
              __assert_fail("iVar == nTtBits",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                            ,0x32a,
                            "int If_ManSatDeriveGiaFromBits(void *, Ifn_Ntk_t *, word *, Vec_Int_t *, Vec_Int_t *)"
                           );
            }
            iVar1 = Abc_LitNotCond((&nPermBits)[p->nObjs + -1],c);
            return iVar1;
          }
          uVar5 = *(uint *)(p->Nodes + iLit) & 7;
          nVars = *(uint *)(p->Nodes + iLit) >> 3 & 0x1f;
          pFaninLits._56_8_ = p->Nodes[iLit].Fanins;
          if (6 < nVars) break;
          if (uVar5 == 3) {
            nVarsNew = 1;
            for (iVar = 0; iVar < (int)nVars; iVar = iVar + 1) {
              nVarsNew = Gia_ManHashAnd((Gia_Man_t *)pGia,nVarsNew,
                                        (&nPermBits)[*(int *)(pFaninLits._56_8_ + (long)iVar * 4)]);
            }
            (&nPermBits)[iLit] = nVarsNew;
          }
          else if (uVar5 == 4) {
            nVarsNew = 0;
            for (iVar = 0; iVar < (int)nVars; iVar = iVar + 1) {
              nVarsNew = Gia_ManHashXor((Gia_Man_t *)pGia,nVarsNew,
                                        (&nPermBits)[*(int *)(pFaninLits._56_8_ + (long)iVar * 4)]);
            }
            (&nPermBits)[iLit] = nVarsNew;
          }
          else if (uVar5 == 5) {
            if (nVars != 3) {
              __assert_fail("nFans == 3",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                            ,0x30d,
                            "int If_ManSatDeriveGiaFromBits(void *, Ifn_Ntk_t *, word *, Vec_Int_t *, Vec_Int_t *)"
                           );
            }
            iVar2 = Gia_ManHashMux((Gia_Man_t *)pGia,(&nPermBits)[*(int *)pFaninLits._56_8_],
                                   (&nPermBits)[p->Nodes[iLit].Fanins[1]],
                                   (&nPermBits)[p->Nodes[iLit].Fanins[2]]);
            (&nPermBits)[iLit] = iVar2;
          }
          else {
            if (uVar5 != 6) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                            ,0x328,
                            "int If_ManSatDeriveGiaFromBits(void *, Ifn_Ntk_t *, word *, Vec_Int_t *, Vec_Int_t *)"
                           );
            }
            wStack_1060 = 0;
            Leaves.pArray._4_4_ = 1 << (sbyte)nVars;
            for (iVar = 0; iVar < Leaves.pArray._4_4_; iVar = iVar + 1) {
              iVar2 = Abc_TtGetBit(pConfigData,local_48);
              if (iVar2 != 0) {
                wStack_1060 = 1L << ((byte)iVar & 0x3f) | wStack_1060;
              }
              local_48 = local_48 + 1;
            }
            wStack_1060 = Abc_Tt6Stretch(wStack_1060,nVars);
            for (iVar = 0; iVar < (int)nVars; iVar = iVar + 1) {
              pFaninLits[(long)iVar + -2] =
                   (&nPermBits)[*(int *)(pFaninLits._56_8_ + (long)iVar * 4)];
            }
            iVar2 = Abc_TtMinBase(&stack0xffffffffffffefa0,(int *)&uTruth,nVars,6);
            if (iVar2 == 0) {
              (&nPermBits)[iLit] = (uint)wStack_1060 & 1;
            }
            else {
              Leaves._0_8_ = &uTruth;
              local_1078._0_4_ = iVar2;
              local_1078._4_4_ = iVar2;
              iVar2 = Kit_TruthToGia((Gia_Man_t *)pGia,(uint *)&stack0xffffffffffffefa0,iVar2,vCover
                                     ,(Vec_Int_t *)local_1078,1);
              (&nPermBits)[iLit] = iVar2;
            }
          }
          iLit = iLit + 1;
        }
        __assert_fail("nFans <= 6",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                      ,0x2fc,
                      "int If_ManSatDeriveGiaFromBits(void *, Ifn_Ntk_t *, word *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      nVarsNew = 0;
      for (iVar = 0; iVar < iVar2; iVar = iVar + 1) {
        iVar3 = Abc_TtGetBit(pConfigData,iVar1 + iLit * iVar2 + iVar);
        if (iVar3 != 0) {
          nVarsNew = 1 << ((byte)iVar & 0x1f) | nVarsNew;
        }
      }
      iVar3 = Abc_Lit2Var(nVarsNew);
      iVar4 = Vec_IntSize(vLeaves);
      if (iVar4 <= iVar3) break;
      pMap = Vec_IntArray(vLeaves);
      iVar3 = Abc_Lit2LitL(pMap,nVarsNew);
      (&nPermBits)[iLit] = iVar3;
      iLit = iLit + 1;
    }
    __assert_fail("Abc_Lit2Var(iLit) < Vec_IntSize(vLeaves)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                  ,0x2f3,
                  "int If_ManSatDeriveGiaFromBits(void *, Ifn_Ntk_t *, word *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  __assert_fail("Vec_IntSize(vLeaves) <= p->nInps && p->nParsVIni < 1000",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                ,0x2ed,
                "int If_ManSatDeriveGiaFromBits(void *, Ifn_Ntk_t *, word *, Vec_Int_t *, Vec_Int_t *)"
               );
}

Assistant:

int If_ManSatDeriveGiaFromBits( void * pGia, Ifn_Ntk_t * p, word * pConfigData, Vec_Int_t * vLeaves, Vec_Int_t * vCover )
{
    Gia_Man_t * pNew = (Gia_Man_t *)pGia;
    int i, k, iLit, iVar = 0, nVarsNew, pVarMap[1000];
    int nTtBits = p->nParsVIni - p->nObjs;
    int nPermBits = Abc_Base2Log(p->nInps + 1) + 1;
    int fCompl = Abc_TtGetBit( pConfigData, nTtBits + nPermBits * p->nInps );
    assert( Vec_IntSize(vLeaves) <= p->nInps && p->nParsVIni < 1000 );
    for ( i = 0; i < p->nInps; i++ )
    {
        for ( iLit = k = 0; k < nPermBits; k++ )
            if ( Abc_TtGetBit(pConfigData, nTtBits + i * nPermBits + k) )
                iLit |= (1 << k);
        assert( Abc_Lit2Var(iLit) < Vec_IntSize(vLeaves) );
        pVarMap[i] = Abc_Lit2LitL( Vec_IntArray(vLeaves), iLit );
    }
    for ( i = p->nInps; i < p->nObjs; i++ )
    {
        int Type = p->Nodes[i].Type;
        int nFans = p->Nodes[i].nFanins;
        int * pFans = p->Nodes[i].Fanins;
        //int iFanin = p->Nodes[i].iFirst;
        assert( nFans <= 6 );
        if ( Type == IFN_DSD_AND )
        {
            iLit = 1;
            for ( k = 0; k < nFans; k++ )
                iLit = Gia_ManHashAnd( pNew, iLit, pVarMap[pFans[k]] );
            pVarMap[i] = iLit;
        }
        else if ( Type == IFN_DSD_XOR )
        {
            iLit = 0;
            for ( k = 0; k < nFans; k++ )
                iLit = Gia_ManHashXor( pNew, iLit, pVarMap[pFans[k]] );
            pVarMap[i] = iLit;
        }
        else if ( Type == IFN_DSD_MUX )
        {
            assert( nFans == 3 );
            pVarMap[i] = Gia_ManHashMux( pNew, pVarMap[pFans[0]], pVarMap[pFans[1]], pVarMap[pFans[2]] );
        }
        else if ( Type == IFN_DSD_PRIME )
        {
            int pFaninLits[16];
            // collect truth table
            word uTruth = 0;
            int nMints = (1 << nFans);
            for ( k = 0; k < nMints; k++ )
                if ( Abc_TtGetBit(pConfigData, iVar++) )
                    uTruth |= ((word)1 << k);
            uTruth = Abc_Tt6Stretch( uTruth, nFans );
            // collect function
            for ( k = 0; k < nFans; k++ )
                pFaninLits[k] = pVarMap[pFans[k]];
            // implement the function
            nVarsNew = Abc_TtMinBase( &uTruth, pFaninLits, nFans, 6 );
            if ( nVarsNew == 0 )
                pVarMap[i] = (int)(uTruth & 1);
            else
            {
                extern int Kit_TruthToGia( Gia_Man_t * pMan, unsigned * pTruth, int nVars, Vec_Int_t * vMemory, Vec_Int_t * vLeaves, int fHash );
                Vec_Int_t Leaves = { nVarsNew, nVarsNew, pFaninLits };
                pVarMap[i] = Kit_TruthToGia( pNew, (unsigned *)&uTruth, nVarsNew, vCover, &Leaves, 1 ); // hashing enabled!!!
            }
        }
        else assert( 0 );
    }
    assert( iVar == nTtBits );
    return Abc_LitNotCond( pVarMap[p->nObjs - 1], fCompl );
}